

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalStartReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  uint uVar1;
  Fts3Phrase *p;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  Fts3DeferredToken **ppFVar5;
  bool bVar6;
  
  if ((pExpr != (Fts3Expr *)0x0) && (*pRc == 0)) {
    if (pExpr->eType == 5) {
      p = pExpr->pPhrase;
      uVar1 = p->nToken;
      if (uVar1 != 0) {
        uVar4 = 0;
        uVar3 = 0;
        if (0 < (int)uVar1) {
          uVar3 = (ulong)uVar1;
        }
        ppFVar5 = &p->aToken[0].pDeferred;
        for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          if (*ppFVar5 == (Fts3DeferredToken *)0x0) {
            uVar3 = uVar4 & 0xffffffff;
            break;
          }
          ppFVar5 = ppFVar5 + 5;
        }
        pExpr->bDeferred = (uint)uVar3 == uVar1;
      }
      iVar2 = fts3EvalPhraseStart(pCsr,1,p);
      *pRc = iVar2;
    }
    else {
      fts3EvalStartReaders(pCsr,pExpr->pLeft,pRc);
      fts3EvalStartReaders(pCsr,pExpr->pRight,pRc);
      if (pExpr->pLeft->bDeferred == '\0') {
        bVar6 = false;
      }
      else {
        bVar6 = pExpr->pRight->bDeferred != '\0';
      }
      pExpr->bDeferred = bVar6;
    }
  }
  return;
}

Assistant:

static void fts3EvalStartReaders(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expression to initialize phrases in */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int nToken = pExpr->pPhrase->nToken;
      if( nToken ){
        int i;
        for(i=0; i<nToken; i++){
          if( pExpr->pPhrase->aToken[i].pDeferred==0 ) break;
        }
        pExpr->bDeferred = (i==nToken);
      }
      *pRc = fts3EvalPhraseStart(pCsr, 1, pExpr->pPhrase);
    }else{
      fts3EvalStartReaders(pCsr, pExpr->pLeft, pRc);
      fts3EvalStartReaders(pCsr, pExpr->pRight, pRc);
      pExpr->bDeferred = (pExpr->pLeft->bDeferred && pExpr->pRight->bDeferred);
    }
  }
}